

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68020_bfins(m68k_info *info)

{
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  cs_m68k *pcVar6;
  m68k_reg mVar7;
  m68k_reg mVar8;
  m68k_reg mVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  int16_t iVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  m68k_address_mode mVar15;
  m68k_reg mVar16;
  m68k_reg mVar17;
  m68k_reg mVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  int16_t iVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  m68k_op_type mVar24;
  m68k_address_mode mVar25;
  cs_m68k_op temp;
  
  if ((info->type & 0x1c) != 0) {
    build_bitfield_ins(info,0x26,1);
    mVar24 = (info->extension).operands[0].type;
    mVar25 = (info->extension).operands[0].address_mode;
    aVar1 = (info->extension).operands[0].field_0;
    mVar16 = (info->extension).operands[0].mem.base_reg;
    mVar17 = (info->extension).operands[0].mem.index_reg;
    mVar18 = (info->extension).operands[0].mem.in_base_reg;
    uVar19 = (info->extension).operands[0].mem.in_disp;
    uVar20 = (info->extension).operands[0].mem.out_disp;
    iVar21 = (info->extension).operands[0].mem.disp;
    uVar22 = (info->extension).operands[0].mem.scale;
    uVar23 = (info->extension).operands[0].mem.bitfield;
    uVar2 = *(undefined8 *)&(info->extension).operands[0].mem.width;
    uVar3 = *(undefined8 *)&(info->extension).operands[0].br_disp.disp_size;
    mVar7 = (info->extension).operands[1].mem.base_reg;
    mVar8 = (info->extension).operands[1].mem.index_reg;
    mVar9 = (info->extension).operands[1].mem.in_base_reg;
    uVar10 = (info->extension).operands[1].mem.in_disp;
    pcVar6 = &info->extension;
    uVar11 = pcVar6->operands[1].mem.out_disp;
    iVar12 = pcVar6->operands[1].mem.disp;
    uVar13 = pcVar6->operands[1].mem.scale;
    uVar14 = pcVar6->operands[1].mem.bitfield;
    uVar4 = *(undefined8 *)&(info->extension).operands[1].mem.width;
    uVar5 = *(undefined8 *)&(info->extension).operands[1].br_disp.disp_size;
    (info->extension).operands[0].field_0 = (info->extension).operands[1].field_0;
    (info->extension).operands[0].mem.base_reg = mVar7;
    (info->extension).operands[0].mem.index_reg = mVar8;
    (info->extension).operands[0].mem.in_base_reg = mVar9;
    (info->extension).operands[0].mem.in_disp = uVar10;
    (info->extension).operands[0].mem.out_disp = uVar11;
    (info->extension).operands[0].mem.disp = iVar12;
    (info->extension).operands[0].mem.scale = uVar13;
    (info->extension).operands[0].mem.bitfield = uVar14;
    *(undefined8 *)&(info->extension).operands[0].mem.width = uVar4;
    *(undefined8 *)&(info->extension).operands[0].br_disp.disp_size = uVar5;
    mVar15 = (info->extension).operands[1].address_mode;
    (info->extension).operands[0].type = (info->extension).operands[1].type;
    (info->extension).operands[0].address_mode = mVar15;
    (info->extension).operands[1].field_0 = aVar1;
    (info->extension).operands[1].mem.base_reg = mVar16;
    (info->extension).operands[1].mem.index_reg = mVar17;
    (info->extension).operands[1].mem.in_base_reg = mVar18;
    (info->extension).operands[1].mem.in_disp = uVar19;
    pcVar6 = &info->extension;
    pcVar6->operands[1].mem.out_disp = uVar20;
    pcVar6->operands[1].mem.disp = iVar21;
    pcVar6->operands[1].mem.scale = uVar22;
    pcVar6->operands[1].mem.bitfield = uVar23;
    *(undefined8 *)&(info->extension).operands[1].mem.width = uVar2;
    *(undefined8 *)&(info->extension).operands[1].br_disp.disp_size = uVar3;
    (info->extension).operands[1].type = mVar24;
    (info->extension).operands[1].address_mode = mVar25;
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_bfins(m68k_info *info)
{
	cs_m68k* ext = &info->extension;
	cs_m68k_op temp;

	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_bitfield_ins(info, M68K_INS_BFINS, true);

	// a bit hacky but we need to flip the args on only this instruction

	temp = ext->operands[0];
	ext->operands[0] = ext->operands[1];
	ext->operands[1] = temp;
}